

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall
Session::Session(Session *this,io_service *ios,string *raw_ip_address,unsigned_short port_num,
                string *request,uint id,Callback callback)

{
  unsigned_long maximum_size;
  allocator<char> local_65 [13];
  address local_58;
  uint local_34;
  string *psStack_30;
  uint id_local;
  string *request_local;
  string *psStack_20;
  unsigned_short port_num_local;
  string *raw_ip_address_local;
  io_service *ios_local;
  Session *this_local;
  
  local_34 = id;
  psStack_30 = request;
  request_local._6_2_ = port_num;
  psStack_20 = raw_ip_address;
  raw_ip_address_local = (string *)ios;
  ios_local = (io_service *)this;
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_socket<boost::asio::io_context>(&this->m_sock,ios,(type *)0x0);
  boost::asio::ip::address::from_string(&local_58,psStack_20);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->m_ep,&local_58,request_local._6_2_);
  std::__cxx11::string::string((string *)&this->m_request,(string *)psStack_30);
  maximum_size = std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->m_response_buf,maximum_size,local_65);
  std::allocator<char>::~allocator(local_65);
  std::__cxx11::string::string((string *)&this->m_response);
  boost::system::error_code::error_code(&this->m_ec);
  this->m_id = local_34;
  this->m_callback = callback;
  this->m_was_cancelled = false;
  std::mutex::mutex(&this->m_cancel_guard);
  return;
}

Assistant:

Session(asio::io_service &ios,
            const std::string &raw_ip_address,
            unsigned short port_num,
            const std::string &request,
            unsigned int id,
            Callback callback) : m_sock(ios),
                                 m_ep(asio::ip::address::from_string(raw_ip_address),
                                      port_num),
                                 m_request(request),
                                 m_id(id),
                                 m_callback(callback),
                                 m_was_cancelled(false) {}